

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DblField.cpp
# Opt level: O0

void __thiscall ki::dml::Field<double>::read_from(Field<double> *this,istream *istream)

{
  ulong uVar1;
  ostream *poVar2;
  parse_error *this_00;
  ValueBytes<unsigned_short> local_1cc [3];
  undefined1 local_1c9;
  string local_1c8 [4];
  ValueBytes<unsigned_short> endianness_check;
  ostringstream local_198 [8];
  ostringstream oss;
  double local_20;
  ValueBytes<double> data;
  istream *istream_local;
  Field<double> *this_local;
  
  data = (ValueBytes<double>)istream;
  istream_local = (istream *)this;
  ValueBytes<double>::ValueBytes((ValueBytes<double> *)&local_20);
  std::istream::read((char *)data,(long)&local_20);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,
                             "Not enough data was available to read DBL value (");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_FieldBase).m_name);
    std::operator<<(poVar2,").");
    local_1c9 = 1;
    this_00 = (parse_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    parse_error::parse_error(this_00,local_1c8);
    local_1c9 = 0;
    __cxa_throw(this_00,&parse_error::typeinfo,parse_error::~parse_error);
  }
  ValueBytes<unsigned_short>::ValueBytes(local_1cc);
  this->m_value = local_20;
  return;
}

Assistant:

void DblField::read_from(std::istream &istream)
	{
		ValueBytes<DBL> data;
		istream.read(data.buff, sizeof(DBL));
		if (istream.fail())
		{
			std::ostringstream oss;
			oss << "Not enough data was available to read DBL value (" << m_name << ").";
			throw parse_error(oss.str());
		}

		ValueBytes<USHRT> endianness_check;
		endianness_check.value = 0x0102;
		if (endianness_check.buff[0] == 0x01)
			std::reverse(&data.buff[0], &data.buff[8]);
		
		m_value = data.value;
	}